

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int i2cZip(uint handle,char *inBuf,uint inLen,char *outBuf,uint outLen)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  undefined4 extraout_var_00;
  uint uVar5;
  uint uVar6;
  char *__format;
  uint numSegs;
  uint local_30c;
  uint local_308;
  uint local_304;
  ulong local_300;
  ulong local_2f8;
  ulong local_2f0;
  char *local_2e8;
  ulong local_2e0;
  pi_i2c_msg_t segs [42];
  undefined4 extraout_var;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    myBuf2Str(inLen,inBuf);
    fprintf(pFVar1,"%s %s: handle=%d inBuf=%s outBuf=%08X len=%d\n",myTimeStamp::buf,"i2cZip",
            (ulong)handle,myBuf2Str::str,outBuf,(ulong)outLen);
  }
  pFVar1 = _stderr;
  if (libInitialised == '\0') {
    iVar2 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x1f;
    }
    myTimeStamp();
    __format = "%s %s: pigpio uninitialised, call gpioInitialise()\n";
  }
  else {
    if ((0x3f < handle) || (i2cInfo[handle].state != 2)) {
      if ((gpioCfg.internals >> 10 & 1) != 0) {
        return -0x19;
      }
      myTimeStamp();
      fprintf(pFVar1,"%s %s: bad handle (%d)\n",myTimeStamp::buf,"i2cZip",(ulong)handle);
      return -0x19;
    }
    if (inBuf == (char *)0x0 || inLen == 0) {
      iVar2 = -0x5a;
      if ((gpioCfg.internals >> 10 & 1) != 0) {
        return -0x5a;
      }
      myTimeStamp();
      __format = "%s %s: input buffer can\'t be NULL\n";
    }
    else {
      if (outLen == 0 || outBuf != (char *)0x0) {
        local_2f0 = (ulong)i2cInfo[handle].addr;
        numSegs = 0;
        local_300 = 0;
        uVar3 = 0;
        local_2f8 = 0;
        uVar6 = 0;
        local_308 = handle;
        local_2e8 = outBuf;
        local_2e0 = (ulong)outLen;
        local_304 = 0;
LAB_0010ae0f:
        pFVar1 = _stderr;
        if ((uVar3 != 0) || (inLen <= uVar6)) {
          if (numSegs != 0 && -1 < (int)uVar3) {
            uVar3 = i2cSegments(local_308,segs,numSegs);
          }
          uVar6 = (uint)local_300;
          if ((int)uVar3 < 0) {
            uVar6 = uVar3;
          }
          return uVar6;
        }
        if ((4 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
          myTimeStamp();
          fprintf(pFVar1,"%s %s: status=%d inpos=%d inlen=%d cmd=%d addr=%d flags=%x\n",
                  myTimeStamp::buf,"i2cZip",0,(ulong)uVar6,(ulong)inLen,
                  (ulong)(uint)(int)inBuf[(int)uVar6],local_2f0,local_2f8);
        }
        local_30c = uVar6 + 1;
        uVar5 = (uint)(byte)inBuf[(int)uVar6];
        if (7 < uVar5) {
          uVar3 = 0xffffff91;
          goto LAB_0010b01d;
        }
        switch(uVar5) {
        case 0:
          uVar3 = 1;
          break;
        case 1:
          uVar3 = 0;
          uVar6 = local_30c;
          local_304 = uVar5;
          goto LAB_0010ae0f;
        case 2:
          uVar3 = 0;
          if (numSegs != 0) {
            uVar3 = i2cSegments(local_308,segs,numSegs);
            uVar3 = (int)uVar3 >> 0x1f & uVar3;
          }
          iVar2 = 1;
          goto LAB_0010aeeb;
        case 3:
          uVar3 = 0;
          if (numSegs != 0) {
            uVar3 = i2cSegments(local_308,segs,numSegs);
            uVar3 = (int)uVar3 >> 0x1f & uVar3;
          }
          iVar2 = 0;
LAB_0010aeeb:
          numSegs = 0;
          i2cSwitchCombined(iVar2);
LAB_0010aef0:
          uVar6 = local_30c;
          local_304 = 0;
          goto LAB_0010ae0f;
        case 4:
          iVar2 = myI2CGetPar(inBuf,(int *)&local_30c,inLen,(int *)&local_304);
          uVar4 = CONCAT44(extraout_var,iVar2);
          local_2f0 = uVar4;
          goto LAB_0010af94;
        case 5:
          local_304 = 1;
          iVar2 = myI2CGetPar(inBuf,(int *)&local_30c,inLen,(int *)&local_304);
          uVar4 = CONCAT44(extraout_var_00,iVar2);
          local_2f8 = uVar4;
LAB_0010af94:
          uVar3 = (int)uVar4 >> 0x1f & 0xffffff91;
          uVar6 = local_30c;
          local_304 = 0;
          goto LAB_0010ae0f;
        case 6:
          iVar2 = myI2CGetPar(inBuf,(int *)&local_30c,inLen,(int *)&local_304);
          if (iVar2 < 0) {
LAB_0010b01b:
            uVar3 = 0xffffff92;
            break;
          }
          uVar6 = iVar2 + (int)local_300;
          if ((uint)local_2e0 <= uVar6) goto LAB_0010b01b;
          segs[(int)numSegs].addr = (uint16_t)local_2f0;
          segs[(int)numSegs].flags = (ushort)local_2f8 | 1;
          segs[(int)numSegs].len = (uint16_t)iVar2;
          segs[(int)numSegs].buf = (uint8_t *)(local_2e8 + (local_300 & 0xffffffff));
          if ((int)numSegs < 0x29) {
            uVar3 = 0;
            numSegs = numSegs + 1;
          }
          else {
            uVar3 = i2cSegments(local_308,segs,numSegs + 1);
            uVar3 = (int)uVar3 >> 0x1f & uVar3;
            numSegs = 0;
          }
          local_300 = (ulong)uVar6;
          goto LAB_0010aef0;
        case 7:
          iVar2 = myI2CGetPar(inBuf,(int *)&local_30c,inLen,(int *)&local_304);
          if (-1 < iVar2) {
            uVar6 = local_30c + iVar2;
            if (uVar6 < inLen) {
              segs[(int)numSegs].addr = (uint16_t)local_2f0;
              segs[(int)numSegs].flags = (ushort)local_2f8 & 0xfffe;
              segs[(int)numSegs].len = (uint16_t)iVar2;
              segs[(int)numSegs].buf = (uint8_t *)(inBuf + (int)local_30c);
              local_30c = uVar6;
              if ((int)numSegs < 0x29) {
                uVar3 = 0;
                numSegs = numSegs + 1;
              }
              else {
                uVar3 = i2cSegments(local_308,segs,numSegs + 1);
                uVar3 = (int)uVar3 >> 0x1f & uVar3;
                numSegs = 0;
              }
              goto LAB_0010aef0;
            }
          }
          uVar3 = 0xffffff93;
        }
LAB_0010b01d:
        uVar6 = local_30c;
        local_304 = 0;
        goto LAB_0010ae0f;
      }
      iVar2 = -0x5a;
      if ((gpioCfg.internals >> 10 & 1) != 0) {
        return -0x5a;
      }
      myTimeStamp();
      __format = "%s %s: output buffer can\'t be NULL\n";
    }
  }
  fprintf(pFVar1,__format,myTimeStamp::buf,"i2cZip");
  return iVar2;
}

Assistant:

int i2cZip(
   unsigned handle,
   char *inBuf, unsigned inLen, char *outBuf, unsigned outLen)
{
   int numSegs, inPos, outPos, status, bytes, flags, addr;
   int esc, setesc;
   pi_i2c_msg_t segs[PI_I2C_RDRW_IOCTL_MAX_MSGS];

   DBG(DBG_USER, "handle=%d inBuf=%s outBuf=%08X len=%d",
      handle, myBuf2Str(inLen, (char *)inBuf), (int)outBuf, outLen);

   CHECK_INITED;

   if (handle >= PI_I2C_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (i2cInfo[handle].state != PI_I2C_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (!inBuf || !inLen)
      SOFT_ERROR(PI_BAD_POINTER, "input buffer can't be NULL");

   if (!outBuf && outLen)
      SOFT_ERROR(PI_BAD_POINTER, "output buffer can't be NULL");

   numSegs = 0;

   inPos = 0;
   outPos = 0;
   status = 0;

   addr = i2cInfo[handle].addr;
   flags = 0;
   esc = 0;
   setesc = 0;

   while (!status && (inPos < inLen))
   {
      DBG(DBG_INTERNAL, "status=%d inpos=%d inlen=%d cmd=%d addr=%d flags=%x",
         status, inPos, inLen, inBuf[inPos], addr, flags);

      switch (inBuf[inPos++])
      {
         case PI_I2C_END:
            status = 1;
            break;

         case PI_I2C_COMBINED_ON:
            /* Run prior transactions before setting combined flag */
            if (numSegs)
            {
               status = i2cSegments(handle, segs, numSegs);
               if (status >= 0) status = 0; /* continue */
               numSegs = 0;
            }
            i2cSwitchCombined(1);
            break;

         case PI_I2C_COMBINED_OFF:
            /* Run prior transactions before clearing combined flag */
            if (numSegs)
            {
               status = i2cSegments(handle, segs, numSegs);
               if (status >= 0) status = 0; /* continue */
               numSegs = 0;
            }
            i2cSwitchCombined(0);
            break;

         case PI_I2C_ADDR:
            addr = myI2CGetPar(inBuf, &inPos, inLen, &esc);
            if (addr < 0) status = PI_BAD_I2C_CMD;
            break;

         case PI_I2C_FLAGS:
            /* cheat to force two byte flags */
            esc = 1;
            flags = myI2CGetPar(inBuf, &inPos, inLen, &esc);
            if (flags < 0) status = PI_BAD_I2C_CMD;
            break;

         case PI_I2C_ESC:
            setesc = 1;
            break;

         case PI_I2C_READ:

            bytes = myI2CGetPar(inBuf, &inPos, inLen, &esc);

            if (bytes >= 0)
            {
               if ((bytes + outPos) < outLen)
               {
                  segs[numSegs].addr = addr;
                  segs[numSegs].flags = (flags|1);
                  segs[numSegs].len = bytes;
                  segs[numSegs].buf = (uint8_t *)(outBuf + outPos);
                  outPos += bytes;
                  numSegs++;
                  if (numSegs >= PI_I2C_RDRW_IOCTL_MAX_MSGS)
                  {
                     status = i2cSegments(handle, segs, numSegs);
                     if (status >= 0) status = 0; /* continue */
                     numSegs = 0;
                  }
               }
               else status = PI_BAD_I2C_RLEN;
            }
            else status = PI_BAD_I2C_RLEN;
            break;

         case PI_I2C_WRITE:

            bytes = myI2CGetPar(inBuf, &inPos, inLen, &esc);

            if (bytes >= 0)
            {
               if ((bytes + inPos) < inLen)
               {
                  segs[numSegs].addr = addr;
                  segs[numSegs].flags = (flags&0xfffe);
                  segs[numSegs].len = bytes;
                  segs[numSegs].buf = (uint8_t *)(inBuf + inPos);
                  inPos += bytes;
                  numSegs++;
                  if (numSegs >= PI_I2C_RDRW_IOCTL_MAX_MSGS)
                  {
                     status = i2cSegments(handle, segs, numSegs);
                     if (status >= 0) status = 0; /* continue */
                     numSegs = 0;
                  }
               }
               else status = PI_BAD_I2C_WLEN;
            }
            else status = PI_BAD_I2C_WLEN;
            break;

         default:
            status = PI_BAD_I2C_CMD;
      }

      if (setesc) esc = 1; else esc = 0;

      setesc = 0;
   }

   if (status >= 0)
   {
      if (numSegs) status = i2cSegments(handle, segs, numSegs);
   }

   if (status >= 0) status = outPos;

   return status;
}